

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfile.c
# Opt level: O3

float32_t bf_get_float32_be(bfile_t *bfile)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  
  bVar1 = bf_get_uint8(bfile);
  bVar2 = bf_get_uint8(bfile);
  bVar3 = bf_get_uint8(bfile);
  bVar4 = bf_get_uint8(bfile);
  return (float32_t)((uint)bVar4 | (uint)bVar3 << 8 | (uint)bVar2 << 0x10 | (uint)bVar1 << 0x18);
}

Assistant:

float32_t
bf_get_float32_be(
    bfile_t * bfile )
{
    union {
        float32_t  real;
        uint8_t    bytes[4];
    } data;

#ifndef WORDS_BIGENDIAN
    data.bytes[3] = bf_get_uint8( bfile );
    data.bytes[2] = bf_get_uint8( bfile );
    data.bytes[1] = bf_get_uint8( bfile );
    data.bytes[0] = bf_get_uint8( bfile );
#else /* WORDS_BIGENDIAN */
    data.bytes[0] = bf_get_uint8( bfile );
    data.bytes[1] = bf_get_uint8( bfile );
    data.bytes[2] = bf_get_uint8( bfile );
    data.bytes[3] = bf_get_uint8( bfile );
#endif /* WORDS_BIGENDIAN */

    return data.real;
}